

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O3

Mat * __thiscall
ncnn::ModelBinFromMemory::load(Mat *__return_storage_ptr__,ModelBinFromMemory *this,int w,int type)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uchar **ppuVar6;
  byte *pbVar7;
  uchar *puVar8;
  uchar *puVar9;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  size_t sVar13;
  
  ppuVar6 = this->mem;
  pbVar7 = *ppuVar6;
  if (pbVar7 != (byte *)0x0) {
    if (type == 1) {
      __return_storage_ptr__->data = pbVar7;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)w;
      *ppuVar6 = pbVar7 + (long)w * 4;
      return __return_storage_ptr__;
    }
    if (type != 0) {
      fprintf(_stderr,"ModelBin load type %d not implemented\n",(ulong)(uint)type);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      return __return_storage_ptr__;
    }
    bVar2 = *pbVar7;
    bVar3 = pbVar7[1];
    bVar4 = pbVar7[2];
    bVar5 = pbVar7[3];
    *ppuVar6 = pbVar7 + 4;
    if (((uint)bVar3 << 8 | (uint)bVar4 << 0x10 | (uint)bVar5 << 0x18 | (uint)bVar2) == 0x1306b47) {
      Mat::from_float16(__return_storage_ptr__,(unsigned_short *)*this->mem,w);
      *this->mem = *this->mem + ((long)w * 2 + 3U & 0xfffffffffffffffc);
      return __return_storage_ptr__;
    }
    if ((uint)bVar3 + (uint)bVar2 + (uint)bVar4 != 0 || bVar5 != 0) {
      puVar8 = *this->mem;
      *this->mem = puVar8 + 0x400;
      puVar9 = *this->mem;
      sVar13 = (size_t)w;
      *this->mem = puVar9 + (sVar13 + 3 & 0xfffffffffffffffc);
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = sVar13;
      if (w == 0) {
        return __return_storage_ptr__;
      }
      pvVar10 = malloc(sVar13 * 4 + 0x1c);
      pvVar11 = (void *)((long)pvVar10 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar11 - 8) = pvVar10;
      __return_storage_ptr__->data = pvVar11;
      piVar1 = (int *)((long)pvVar11 + sVar13 * 4);
      __return_storage_ptr__->refcount = piVar1;
      *piVar1 = 1;
      if (w < 1) {
        return __return_storage_ptr__;
      }
      uVar12 = 0;
      do {
        *(undefined4 *)((long)pvVar11 + uVar12 * 4) =
             *(undefined4 *)(puVar8 + (ulong)puVar9[uVar12] * 4);
        uVar12 = uVar12 + 1;
      } while ((uint)w != uVar12);
      return __return_storage_ptr__;
    }
    if (bVar2 == 0) {
      ppuVar6 = this->mem;
      puVar8 = *ppuVar6;
      __return_storage_ptr__->data = puVar8;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->elemsize = 4;
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)w;
      *ppuVar6 = puVar8 + (long)w * 4;
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->elemsize = 0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMemory::load(int w, int type) const
{
    if (!mem)
        return Mat();

    if (type == 0)
    {
        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        memcpy(&flag_struct, mem, sizeof(flag_struct));
        mem += sizeof(flag_struct);

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            Mat m = Mat::from_float16((unsigned short*)mem, w);
            mem += alignSize(w * sizeof(unsigned short), 4);
            return m;
        }

        if (flag != 0)
        {
            // quantized data
            const float* quantization_value = (const float*)mem;
            mem += 256 * sizeof(float);

            const unsigned char* index_array = (const unsigned char*)mem;
            mem += alignSize(w * sizeof(unsigned char), 4);

            Mat m(w);
            if (m.empty())
                return m;

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[ index_array[i] ];
            }

            return m;
        }
        else if (flag_struct.f0 == 0)
        {
            // raw data
            Mat m = Mat(w, (float*)mem);
            mem += w * sizeof(float);
            return m;
        }
    }
    else if (type == 1)
    {
        // raw data
        Mat m = Mat(w, (float*)mem);
        mem += w * sizeof(float);
        return m;
    }
    else
    {
        fprintf(stderr, "ModelBin load type %d not implemented\n", type);
        return Mat();
    }

    return Mat();
}